

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int relocatePage(BtShared *pBt,MemPage *pDbPage,u8 eType,Pgno iPtrPage,Pgno iFreePage,int isCommit)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  Pgno newPgno;
  Pager *pPager;
  PgHdr *pPg;
  MemPage *pPage;
  int iVar4;
  u32 uVar5;
  DbPage *p;
  Pgno i;
  ulong uVar6;
  uint *puVar7;
  u8 *puVar8;
  long in_FS_OFFSET;
  int local_64;
  MemPage *local_60;
  undefined1 local_58 [20];
  ushort uStack_44;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = pDbPage->pgno;
  if (uVar3 < 3) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar4 = 0x123c8;
      goto LAB_0013c0ab;
    }
    goto LAB_0013c4ca;
  }
  pPager = pBt->pPager;
  pPg = pDbPage->pDbPage;
  if ((pPager->tempFile == '\0') || (iVar4 = sqlite3PagerWrite(pPg), iVar4 == 0)) {
    uVar2 = pPg->flags;
    if ((uVar2 & 2) != 0) {
      iVar4 = subjournalPageIfRequired(pPg);
      if (iVar4 != 0) goto LAB_0013c2b8;
      uVar2 = pPg->flags;
    }
    i = 0;
    if ((isCommit == 0) && (i = 0, (uVar2 & 8) != 0)) {
      i = pPg->pgno;
    }
    pPg->flags = uVar2 & 0xfff7;
    p = sqlite3PagerLookup(pPager,iFreePage);
    if (p != (DbPage *)0x0) {
      if (1 < p->nRef) {
        sqlite3PagerUnrefNotNull(p);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          iVar4 = 0xfc16;
LAB_0013c0ab:
          iVar4 = sqlite3CorruptError(iVar4);
          return iVar4;
        }
        goto LAB_0013c4ca;
      }
      pPg->flags = pPg->flags | p->flags & 8;
      if (pPager->tempFile == '\0') {
        sqlite3PcacheDrop(p);
      }
      else {
        sqlite3PcacheMove(p,pPager->dbSize + 1);
      }
    }
    newPgno = pPg->pgno;
    sqlite3PcacheMove(pPg,iFreePage);
    sqlite3PcacheMakeDirty(pPg);
    if ((p != (DbPage *)0x0) && (pPager->tempFile != '\0')) {
      sqlite3PcacheMove(p,newPgno);
      sqlite3PagerUnrefNotNull(p);
    }
    if (i != 0) {
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      iVar4 = (*pPager->xGet)(pPager,i,(DbPage **)local_58,0);
      if (iVar4 != 0) {
        if (i <= pPager->dbOrigSize) {
          sqlite3BitvecClear(pPager->pInJournal,i,pPager->pTmpSpace);
        }
        goto LAB_0013c2b8;
      }
      *(u16 *)(local_58._0_8_ + 0x34) = *(u16 *)(local_58._0_8_ + 0x34) | 8;
      sqlite3PcacheMakeDirty((PgHdr *)local_58._0_8_);
      sqlite3PagerUnrefNotNull((DbPage *)local_58._0_8_);
    }
    local_64 = 0;
    pDbPage->pgno = iFreePage;
    if ((eType & 0xfb) == 1) {
      iVar4 = setChildPtrmaps(pDbPage);
      if ((iVar4 == 0) && (iVar4 = 0, eType != '\x01')) {
LAB_0013c29a:
        local_60 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
        iVar4 = btreeGetPage(pBt,iPtrPage,&local_60,0);
        pPage = local_60;
        if (iVar4 == 0) {
          iVar4 = sqlite3PagerWrite(local_60->pDbPage);
          if (iVar4 == 0) {
            if (eType == '\x04') {
              puVar7 = (uint *)pPage->aData;
              uVar5 = sqlite3Get4byte((u8 *)puVar7);
              if (uVar5 == uVar3) {
                *puVar7 = iFreePage >> 0x18 | (iFreePage & 0xff0000) >> 8 |
                          (iFreePage & 0xff00) << 8 | iFreePage << 0x18;
LAB_0013c48f:
                iVar4 = 0;
              }
              else {
                iVar4 = sqlite3CorruptError(0x1237d);
              }
            }
            else if ((pPage->isInit != '\0') || (iVar4 = btreeInitPage(pPage), iVar4 == 0)) {
              uVar2 = pPage->nCell;
              for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
                puVar7 = (uint *)(pPage->aData +
                                 (CONCAT11(pPage->aCellIdx[uVar6 * 2],pPage->aCellIdx[uVar6 * 2 + 1]
                                          ) & pPage->maskPage));
                if (eType == '\x03') {
                  stack0xffffffffffffffb8 = &DAT_aaaaaaaaaaaaaaaa;
                  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  (*pPage->xParseCell)(pPage,(u8 *)puVar7,(CellInfo *)local_58);
                  if ((uint)uStack_44 < (uint)local_58._16_4_) {
                    puVar8 = (u8 *)((long)puVar7 + ((ulong)stack0xffffffffffffffb8 >> 0x30));
                    if (pPage->aData + pPage->pBt->usableSize < puVar8) {
                      iVar4 = 0x12390;
                      goto LAB_0013c473;
                    }
                    uVar5 = sqlite3Get4byte(puVar8 + -4);
                    if (uVar5 == uVar3) {
                      *(Pgno *)(puVar8 + -4) =
                           iFreePage >> 0x18 | (iFreePage & 0xff0000) >> 8 |
                           (iFreePage & 0xff00) << 8 | iFreePage << 0x18;
                      goto LAB_0013c48f;
                    }
                  }
                }
                else {
                  if (pPage->aData + pPage->pBt->usableSize < puVar7 + 1) {
                    iVar4 = 0x12399;
                    goto LAB_0013c473;
                  }
                  uVar5 = sqlite3Get4byte((u8 *)puVar7);
                  if (uVar5 == uVar3) {
                    *puVar7 = iFreePage >> 0x18 | (iFreePage & 0xff0000) >> 8 |
                              (iFreePage & 0xff00) << 8 | iFreePage << 0x18;
                    goto LAB_0013c48f;
                  }
                }
              }
              if (eType == '\x05') {
                puVar8 = pPage->aData;
                bVar1 = pPage->hdrOffset;
                uVar5 = sqlite3Get4byte(puVar8 + (ulong)bVar1 + 8);
                if (uVar5 == uVar3) {
                  *(Pgno *)(puVar8 + (ulong)bVar1 + 8) =
                       iFreePage >> 0x18 | (iFreePage & 0xff0000) >> 8 | (iFreePage & 0xff00) << 8 |
                       iFreePage << 0x18;
                  goto LAB_0013c48f;
                }
              }
              iVar4 = 0x123a5;
LAB_0013c473:
              iVar4 = sqlite3CorruptError(iVar4);
            }
            local_64 = iVar4;
            releasePage(pPage);
            if (iVar4 == 0) {
              ptrmapPut(pBt,iFreePage,eType,iPtrPage,&local_64);
              iVar4 = local_64;
            }
          }
          else {
            releasePage(pPage);
          }
        }
      }
    }
    else {
      uVar5 = sqlite3Get4byte(pDbPage->aData);
      if ((uVar5 == 0) ||
         (ptrmapPut(pBt,uVar5,'\x04',iFreePage,&local_64), iVar4 = local_64, local_64 == 0))
      goto LAB_0013c29a;
    }
  }
LAB_0013c2b8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar4;
  }
LAB_0013c4ca:
  __stack_chk_fail();
}

Assistant:

static int relocatePage(
  BtShared *pBt,           /* Btree */
  MemPage *pDbPage,        /* Open page to move */
  u8 eType,                /* Pointer map 'type' entry for pDbPage */
  Pgno iPtrPage,           /* Pointer map 'page-no' entry for pDbPage */
  Pgno iFreePage,          /* The location to move pDbPage to */
  int isCommit             /* isCommit flag passed to sqlite3PagerMovepage */
){
  MemPage *pPtrPage;   /* The page that contains a pointer to pDbPage */
  Pgno iDbPage = pDbPage->pgno;
  Pager *pPager = pBt->pPager;
  int rc;

  assert( eType==PTRMAP_OVERFLOW2 || eType==PTRMAP_OVERFLOW1 ||
      eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE );
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pDbPage->pBt==pBt );
  if( iDbPage<3 ) return SQLITE_CORRUPT_BKPT;

  /* Move page iDbPage from its current location to page number iFreePage */
  TRACE(("AUTOVACUUM: Moving %u to free page %u (ptr page %u type %u)\n",
      iDbPage, iFreePage, iPtrPage, eType));
  rc = sqlite3PagerMovepage(pPager, pDbPage->pDbPage, iFreePage, isCommit);
  if( rc!=SQLITE_OK ){
    return rc;
  }
  pDbPage->pgno = iFreePage;

  /* If pDbPage was a btree-page, then it may have child pages and/or cells
  ** that point to overflow pages. The pointer map entries for all these
  ** pages need to be changed.
  **
  ** If pDbPage is an overflow page, then the first 4 bytes may store a
  ** pointer to a subsequent overflow page. If this is the case, then
  ** the pointer map needs to be updated for the subsequent overflow page.
  */
  if( eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE ){
    rc = setChildPtrmaps(pDbPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
  }else{
    Pgno nextOvfl = get4byte(pDbPage->aData);
    if( nextOvfl!=0 ){
      ptrmapPut(pBt, nextOvfl, PTRMAP_OVERFLOW2, iFreePage, &rc);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  /* Fix the database pointer on page iPtrPage that pointed at iDbPage so
  ** that it points at iFreePage. Also fix the pointer map entry for
  ** iPtrPage.
  */
  if( eType!=PTRMAP_ROOTPAGE ){
    rc = btreeGetPage(pBt, iPtrPage, &pPtrPage, 0);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    rc = sqlite3PagerWrite(pPtrPage->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(pPtrPage);
      return rc;
    }
    rc = modifyPagePointer(pPtrPage, iDbPage, iFreePage, eType);
    releasePage(pPtrPage);
    if( rc==SQLITE_OK ){
      ptrmapPut(pBt, iFreePage, eType, iPtrPage, &rc);
    }
  }
  return rc;
}